

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Processor *p)

{
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *pvVar1;
  vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_> *__x;
  Expression *latency;
  Module *pMVar2;
  pointer ppVar3;
  Function *f;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> structs;
  unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  __p;
  uint32_t uVar4;
  pool_ref<soul::AST::Function> *__begin2;
  pointer ppVar5;
  Annotation local_58;
  
  (this->sourceProcessor).object = p;
  latency = (p->latency).object;
  if (latency != (Expression *)0x0) {
    uVar4 = SanityCheckPass::checkLatency(latency);
    this->module->latency = uVar4;
  }
  pvVar1 = &(p->super_ProcessorBase).super_ModuleBase.structures;
  structs.s = (pvVar1->
              super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  structs.e = (pvVar1->
              super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  generateStructs(this,structs);
  AST::Annotation::toPlainAnnotation
            (&local_58,&(p->super_ProcessorBase).annotation,
             &((this->module->program).pimpl)->stringDictionary);
  __p._M_t.
  super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  .
  super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  ._M_head_impl =
       local_58.properties._M_t.
       super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
       .
       super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
       ._M_head_impl;
  pMVar2 = this->module;
  local_58.properties._M_t.
  super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  .
  super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
           *)&pMVar2->annotation,
          (pointer)__p._M_t.
                   super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
                   ._M_head_impl);
  __x = &local_58.dictionary.strings;
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
  operator=(&(pMVar2->annotation).dictionary.strings,__x);
  (pMVar2->annotation).dictionary.nextIndex = local_58.dictionary.nextIndex;
  local_58.dictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002f5170;
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::~vector
            (__x);
  std::
  unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ::~unique_ptr(&local_58.properties);
  this->parsingStateVariables = true;
  ASTVisitor::visit(&this->super_ASTVisitor,p);
  this->parsingStateVariables = false;
  ppVar3 = (p->functions).
           super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (p->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar3; ppVar5 = ppVar5 + 1) {
    f = ppVar5->object;
    if ((f->genericWildcards).
        super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (f->genericWildcards).
        super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      generateFunction(this,f);
    }
  }
  return;
}

Assistant:

void visit (AST::Processor& p) override
    {
        sourceProcessor = p;

        if (p.latency != nullptr)
            module.latency = SanityCheckPass::checkLatency (*p.latency);

        generateStructs (p.structures);

        module.annotation = p.annotation.toPlainAnnotation (module.program.getStringDictionary());

        parsingStateVariables = true;
        super::visit (p);
        parsingStateVariables = false;

        generateFunctions (p.functions);
    }